

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate2<std::complex<double>_>::apply
          (QGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  long lVar1;
  long lVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  double dVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  undefined7 in_register_00000031;
  long lVar17;
  char *__assertion;
  long lVar18;
  int iVar19;
  long lVar20;
  double dVar21;
  complex<double> x4;
  complex<double> x3;
  complex<double> x2;
  complex<double> x1;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<std::complex<double>_> local_168;
  SquareMatrix<std::complex<double>_> local_150;
  long local_140;
  double local_138;
  _Head_base<0UL,_std::complex<double>_*,_false> _Stack_130;
  double local_128;
  _Head_base<0UL,_std::complex<double>_*,_false> _Stack_120;
  double local_118;
  _Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_> _Stack_110;
  double local_108;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> _Stack_100;
  complex<double> local_f8;
  complex<double> local_e8;
  complex<double> local_d8;
  complex<double> local_c8;
  ulong local_b0;
  double local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  ulong local_80;
  double local_78;
  int local_6c;
  SquareMatrix<std::complex<double>_> local_68;
  int *local_58 [2];
  long local_48;
  long local_40;
  long local_38;
  
  local_140 = CONCAT44(local_140._4_4_,(int)CONCAT71(in_register_00000031,side));
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[5])(local_58,this);
  iVar12 = *local_58[0] + offset;
  *local_58[0] = iVar12;
  iVar19 = offset + local_58[0][1];
  local_58[0][1] = iVar19;
  if (iVar12 < nbQubits) {
    if (iVar19 < nbQubits) {
      if (iVar12 + 1 != iVar19) {
        __assert_fail("qubits[0] + 1 == qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                      ,0x29,
                      "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                     );
      }
      (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(&local_150,this);
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&local_150);
      if ((char)local_140 == 'L') {
        if (nbQubits == 2) {
          dense::SquareMatrix<std::complex<double>_>::operator*=(matrix,&local_150);
        }
        else {
          local_a0 = CONCAT44(local_a0._4_4_,~local_58[0][1] + nbQubits);
          lVar17 = matrix->size_;
          if (0 < lVar17) {
            local_78 = (double)(long)(1 << ((byte)(~local_58[0][1] + nbQubits) & 0x1f));
            iVar12 = *local_58[0];
            uVar16 = 1 << ((byte)iVar12 & 0x1f);
            local_a8 = 4.94065645841247e-324;
            if (1 < (long)local_78) {
              local_a8 = local_78;
            }
            local_38 = (long)local_78 * 4;
            if ((int)uVar16 < 2) {
              uVar16 = 1;
            }
            local_b0 = (ulong)uVar16;
            local_80 = (long)local_78 * 2;
            local_88 = (long)local_78 * 3;
            lVar18 = 0;
            local_6c = iVar12;
            do {
              if (iVar12 != 0x1f) {
                lVar17 = lVar18 << 4;
                lVar20 = 0;
                uVar14 = 0;
                local_140 = lVar17;
                local_40 = lVar18;
                do {
                  dVar13 = local_a8;
                  local_98 = uVar14;
                  local_90 = lVar20;
                  if ((int)local_a0 != 0x1f) {
                    do {
                      lVar18 = (long)local_78 + lVar20;
                      lVar15 = local_80 + lVar20;
                      lVar1 = local_88 + lVar20;
                      lVar2 = matrix->size_;
                      pcVar3 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_c8._M_value._0_8_ =
                           *(undefined8 *)(pcVar3[lVar2 * lVar20]._M_value + lVar17);
                      local_c8._M_value._8_8_ =
                           *(undefined8 *)((long)(pcVar3[lVar2 * lVar20]._M_value + lVar17) + 8);
                      local_d8._M_value._0_8_ =
                           *(undefined8 *)(pcVar3[lVar2 * lVar18]._M_value + lVar17);
                      local_d8._M_value._8_8_ =
                           *(undefined8 *)((long)(pcVar3[lVar2 * lVar18]._M_value + lVar17) + 8);
                      local_e8._M_value._0_8_ =
                           *(undefined8 *)(pcVar3[lVar2 * lVar15]._M_value + lVar17);
                      local_e8._M_value._8_8_ =
                           *(undefined8 *)((long)(pcVar3[lVar2 * lVar15]._M_value + lVar17) + 8);
                      local_f8._M_value._0_8_ =
                           *(undefined8 *)(pcVar3[lVar2 * lVar1]._M_value + lVar17);
                      local_f8._M_value._8_8_ =
                           *(undefined8 *)((long)(pcVar3[lVar2 * lVar1]._M_value + lVar17) + 8);
                      local_168.size_ =
                           *(size_type_conflict *)
                            local_150.data_._M_t.
                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)local_150.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 8))->_M_t;
                      local_108 = dVar13;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                      local_118 = (double)local_168.size_;
                      _Stack_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x10))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                      local_128 = (double)local_168.size_;
                      _Stack_120._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)local_150.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x28))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                      local_138 = (double)local_168.size_;
                      _Stack_130._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x30))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)local_150.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x38))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                      dVar13 = (double)_Stack_110.
                                       super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + (double)_Stack_120._M_head_impl +
                               (double)_Stack_130._M_head_impl +
                               (double)local_168.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl;
                      auVar4._8_4_ = SUB84(dVar13,0);
                      auVar4._0_8_ = local_118 + local_128 + local_138 + (double)local_168.size_;
                      auVar4._12_4_ = (int)((ulong)dVar13 >> 0x20);
                      *(undefined1 (*) [16])
                       ((matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                        [matrix->size_ * lVar20]._M_value + local_140) = auVar4;
                      pcVar3 = (complex<double> *)
                               ((long)local_150.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_150.size_ * 0x10);
                      local_168.size_ = *(size_type_conflict *)pcVar3->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)pcVar3->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                      local_118 = (double)local_168.size_;
                      _Stack_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_150.size_ + 1) * 0x10))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_150.size_ + 1) * 0x10))->
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                      local_128 = (double)local_168.size_;
                      _Stack_120._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))[local_150.size_]._M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x20))[local_150.size_]._M_value +
                                    8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                      local_138 = (double)local_168.size_;
                      _Stack_130._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_150.size_ + 3) * 0x10))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_150.size_ + 3) * 0x10))->
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                      dVar13 = (double)_Stack_110.
                                       super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + (double)_Stack_120._M_head_impl +
                               (double)_Stack_130._M_head_impl +
                               (double)local_168.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl;
                      auVar5._8_4_ = SUB84(dVar13,0);
                      auVar5._0_8_ = local_118 + local_128 + local_138 + (double)local_168.size_;
                      auVar5._12_4_ = (int)((ulong)dVar13 >> 0x20);
                      *(undefined1 (*) [16])
                       ((matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                        [lVar18 * matrix->size_]._M_value + local_140) = auVar5;
                      pcVar3 = (complex<double> *)
                               ((long)local_150.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_150.size_ * 0x20);
                      local_168.size_ = *(size_type_conflict *)pcVar3->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)pcVar3->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                      local_118 = (double)local_168.size_;
                      _Stack_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x10))[local_150.size_ * 2]._M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x10))[local_150.size_ * 2].
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                      local_128 = (double)local_168.size_;
                      _Stack_120._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))[local_150.size_ * 2]._M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x20))[local_150.size_ * 2].
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                      local_138 = (double)local_168.size_;
                      _Stack_130._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_150.size_ * 2 + 3) * 0x10))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_150.size_ * 2 + 3) * 0x10))
                                           ->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                      dVar13 = (double)_Stack_110.
                                       super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + (double)_Stack_120._M_head_impl +
                               (double)_Stack_130._M_head_impl +
                               (double)local_168.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl;
                      auVar6._8_4_ = SUB84(dVar13,0);
                      auVar6._0_8_ = local_118 + local_128 + local_138 + (double)local_168.size_;
                      auVar6._12_4_ = (int)((ulong)dVar13 >> 0x20);
                      *(undefined1 (*) [16])
                       ((matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                        [lVar15 * matrix->size_]._M_value + local_140) = auVar6;
                      pcVar3 = (complex<double> *)
                               ((long)local_150.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                      .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                      _M_head_impl + local_150.size_ * 0x30);
                      local_168.size_ = *(size_type_conflict *)pcVar3->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)pcVar3->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                      local_118 = (double)local_168.size_;
                      _Stack_110.super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           (_Head_base<0UL,_std::complex<double>_*,_false>)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + (local_150.size_ * 3 + 1) * 0x10))->_M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + (local_150.size_ * 3 + 1) * 0x10))
                                           ->_M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                      local_128 = (double)local_168.size_;
                      _Stack_120._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x20))[local_150.size_ * 3]._M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                             *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  *)((long)((complex<double> *)
                                           ((long)local_150.data_._M_t.
                                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                  .
                                                  super__Head_base<0UL,_std::complex<double>_*,_false>
                                                  ._M_head_impl + 0x20))[local_150.size_ * 3].
                                           _M_value + 8))->_M_t;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                      local_138 = (double)local_168.size_;
                      _Stack_130._M_head_impl =
                           (complex<double> *)
                           local_168.data_._M_t.
                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      local_168.size_ =
                           *(size_type_conflict *)
                            ((complex<double> *)
                            ((long)local_150.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                   .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                   _M_head_impl + 0x30))[local_150.size_ * 3]._M_value;
                      local_168.data_._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                           (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                            )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                             ((long)((complex<double> *)
                                    ((long)local_150.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl + 0x30))[local_150.size_ * 3]._M_value + 8))
                             ->_M_head_impl;
                      std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                      dVar13 = (double)_Stack_110.
                                       super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl + (double)_Stack_120._M_head_impl +
                               (double)_Stack_130._M_head_impl +
                               (double)local_168.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                       .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                       _M_head_impl;
                      auVar7._8_4_ = SUB84(dVar13,0);
                      auVar7._0_8_ = local_118 + local_128 + local_138 + (double)local_168.size_;
                      auVar7._12_4_ = (int)((ulong)dVar13 >> 0x20);
                      *(undefined1 (*) [16])
                       ((matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                        [lVar1 * matrix->size_]._M_value + local_140) = auVar7;
                      lVar20 = lVar20 + 1;
                      dVar13 = (double)((long)local_108 + -1);
                      lVar17 = local_140;
                    } while (dVar13 != 0.0);
                  }
                  uVar14 = local_98 + 1;
                  lVar20 = local_90 + local_38;
                } while (uVar14 != local_b0);
                lVar17 = matrix->size_;
                lVar18 = local_40;
                iVar12 = local_6c;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < lVar17);
          }
        }
      }
      else if (nbQubits == 2) {
        dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_68,&local_150);
        dense::SquareMatrix<std::complex<double>_>::operator*=(&local_68,matrix);
        dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_168,&local_68);
        dense::SquareMatrix<std::complex<double>_>::operator=(matrix,&local_168);
        if ((_Head_base<0UL,_std::complex<double>_*,_false>)
            local_168.data_._M_t.
            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
            (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
          operator_delete__((void *)local_168.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl);
        }
        local_168.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               0x0;
        if (local_68.data_._M_t.
            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0
           ) {
          operator_delete__((void *)local_68.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl);
        }
        local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
               0x0;
      }
      else {
        local_88 = CONCAT44(local_88._4_4_,~local_58[0][1] + nbQubits);
        lVar17 = matrix->size_;
        if (0 < lVar17) {
          lVar18 = (long)(1 << ((byte)(~local_58[0][1] + nbQubits) & 0x1f));
          iVar12 = *local_58[0];
          uVar16 = 1 << ((byte)iVar12 & 0x1f);
          local_90 = 1;
          if (1 < lVar18) {
            local_90 = lVar18;
          }
          local_98 = (ulong)uVar16;
          if ((int)uVar16 < 2) {
            local_98 = 1;
          }
          local_a0 = lVar18 << 6;
          local_140 = lVar18 * 0x10;
          local_118 = (double)(lVar18 << 5);
          lVar20 = 0;
          dVar13 = 0.0;
          local_b0 = CONCAT44(local_b0._4_4_,iVar12);
          do {
            if (iVar12 != 0x1f) {
              dVar21 = 0.0;
              uVar14 = 0;
              local_a8 = dVar13;
              do {
                lVar17 = local_90;
                local_80 = uVar14;
                local_78 = dVar21;
                if ((int)local_88 != 0x1f) {
                  do {
                    lVar15 = matrix->size_ * lVar20;
                    pcVar3 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_c8._M_value._0_8_ =
                         *(undefined8 *)(pcVar3->_M_value + (long)dVar21 + lVar15);
                    local_c8._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar3->_M_value + (long)dVar21 + lVar15) + 8);
                    lVar15 = (long)dVar21 + lVar15;
                    local_d8._M_value._0_8_ = *(undefined8 *)(pcVar3->_M_value + local_140 + lVar15)
                    ;
                    local_d8._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar3->_M_value + local_140 + lVar15) + 8);
                    local_e8._M_value._0_8_ =
                         *(undefined8 *)(pcVar3->_M_value + (long)local_118 + lVar15);
                    local_e8._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar3->_M_value + (long)local_118 + lVar15) + 8);
                    local_f8._M_value._0_8_ = *(undefined8 *)(pcVar3[lVar18 * 3]._M_value + lVar15);
                    local_f8._M_value._8_8_ =
                         *(undefined8 *)((long)(pcVar3[lVar18 * 3]._M_value + lVar15) + 8);
                    local_168.size_ =
                         *(size_type_conflict *)
                          local_150.data_._M_t.
                          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_150.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                    local_128 = (double)local_168.size_;
                    _Stack_120._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + local_150.size_ * 0x10))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + local_150.size_ * 0x10))->_M_value +
                                  8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                    local_138 = (double)local_168.size_;
                    _Stack_130._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    pcVar3 = (complex<double> *)
                             ((long)local_150.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + local_150.size_ * 0x20);
                    local_168.size_ = *(size_type_conflict *)pcVar3->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)pcVar3->_M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                    local_108 = (double)local_168.size_;
                    _Stack_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_168.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    pcVar3 = (complex<double> *)
                             ((long)local_150.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                    .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                    _M_head_impl + local_150.size_ * 0x30);
                    local_168.size_ = *(size_type_conflict *)pcVar3->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)pcVar3->_M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                    dVar13 = (double)_Stack_120._M_head_impl + (double)_Stack_130._M_head_impl +
                             (double)_Stack_100._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl +
                             (double)local_168.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                    auVar8._8_4_ = SUB84(dVar13,0);
                    auVar8._0_8_ = local_128 + local_138 + local_108 + (double)local_168.size_;
                    auVar8._12_4_ = (int)((ulong)dVar13 >> 0x20);
                    *(undefined1 (*) [16])
                     (((matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value
                     + (long)dVar21 + matrix->size_ * lVar20) = auVar8;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x10))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_150.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x18))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                    local_128 = (double)local_168.size_;
                    _Stack_120._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_150.size_ + 1) * 0x10))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_150.size_ + 1) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                    local_138 = (double)local_168.size_;
                    _Stack_130._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x10))[local_150.size_ * 2]._M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x10))[local_150.size_ * 2]._M_value
                                  + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                    local_108 = (double)local_168.size_;
                    _Stack_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_168.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_150.size_ * 3 + 1) * 0x10))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_150.size_ * 3 + 1) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                    dVar13 = (double)_Stack_120._M_head_impl + (double)_Stack_130._M_head_impl +
                             (double)_Stack_100._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl +
                             (double)local_168.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                    auVar9._8_4_ = SUB84(dVar13,0);
                    auVar9._0_8_ = local_128 + local_138 + local_108 + (double)local_168.size_;
                    auVar9._12_4_ = (int)((ulong)dVar13 >> 0x20);
                    *(undefined1 (*) [16])
                     (((matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value
                     + (long)dVar21 + local_140 + matrix->size_ * lVar20) = auVar9;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x20))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_150.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x28))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                    local_128 = (double)local_168.size_;
                    _Stack_120._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x20))[local_150.size_]._M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x20))[local_150.size_]._M_value + 8
                                  ))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                    local_138 = (double)local_168.size_;
                    _Stack_130._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x20))[local_150.size_ * 2]._M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x20))[local_150.size_ * 2]._M_value
                                  + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                    local_108 = (double)local_168.size_;
                    _Stack_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_168.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_150.size_ * 3 + 2) * 0x10))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_150.size_ * 3 + 2) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                    dVar13 = (double)_Stack_120._M_head_impl + (double)_Stack_130._M_head_impl +
                             (double)_Stack_100._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl +
                             (double)local_168.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                    auVar10._8_4_ = SUB84(dVar13,0);
                    auVar10._0_8_ = local_128 + local_138 + local_108 + (double)local_168.size_;
                    auVar10._12_4_ = (int)((ulong)dVar13 >> 0x20);
                    *(undefined1 (*) [16])
                     (((matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value
                     + (long)dVar21 + (long)local_118 + matrix->size_ * lVar20) = auVar10;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x30))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)local_150.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x38))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_c8);
                    local_128 = (double)local_168.size_;
                    _Stack_120._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + (local_150.size_ + 3) * 0x10))->_M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + (local_150.size_ + 3) * 0x10))->
                                         _M_value + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_d8);
                    local_138 = (double)local_168.size_;
                    _Stack_130._M_head_impl =
                         (complex<double> *)
                         local_168.data_._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x30))[local_150.size_ * 2]._M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         *(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                           *)&((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                *)((long)((complex<double> *)
                                         ((long)local_150.data_._M_t.
                                                super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                                .
                                                super__Head_base<0UL,_std::complex<double>_*,_false>
                                                ._M_head_impl + 0x30))[local_150.size_ * 2]._M_value
                                  + 8))->_M_t;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_e8);
                    local_108 = (double)local_168.size_;
                    _Stack_100._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                          )(tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                            )local_168.data_._M_t.
                             super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                    local_168.size_ =
                         *(size_type_conflict *)
                          ((complex<double> *)
                          ((long)local_150.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                 .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                          + 0x30))[local_150.size_ * 3]._M_value;
                    local_168.data_._M_t.
                    super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                    .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
                         (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
                          )((_Head_base<0UL,_std::complex<double>_*,_false> *)
                           ((long)((complex<double> *)
                                  ((long)local_150.data_._M_t.
                                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                         .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                         _M_head_impl + 0x30))[local_150.size_ * 3]._M_value + 8))->
                           _M_head_impl;
                    std::complex<double>::operator*=((complex<double> *)&local_168,&local_f8);
                    dVar13 = (double)_Stack_120._M_head_impl + (double)_Stack_130._M_head_impl +
                             (double)_Stack_100._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl +
                             (double)local_168.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl;
                    auVar11._8_4_ = SUB84(dVar13,0);
                    auVar11._0_8_ = local_128 + local_138 + local_108 + (double)local_168.size_;
                    auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
                    *(undefined1 (*) [16])
                     ((matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                      .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar18 * 3]
                      ._M_value + (long)dVar21 + matrix->size_ * lVar20) = auVar11;
                    dVar21 = (double)((long)dVar21 + 0x10);
                    lVar17 = lVar17 + -1;
                  } while (lVar17 != 0);
                }
                uVar14 = local_80 + 1;
                dVar21 = (double)((long)local_78 + local_a0);
              } while (uVar14 != local_98);
              lVar17 = matrix->size_;
              dVar13 = local_a8;
              iVar12 = (int)local_b0;
            }
            dVar13 = (double)((long)dVar13 + 1);
            lVar20 = lVar20 + 0x10;
          } while ((long)dVar13 < lVar17);
        }
      }
      if (local_150.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0)
      {
        operator_delete__((void *)local_150.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                  .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                         );
      }
      if (local_58[0] != (int *)0x0) {
        operator_delete(local_58[0],local_48 - (long)local_58[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,0x28,
                "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }